

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_show_eig(REF_INT n,REF_DBL *a,REF_DBL *values,REF_DBL *vectors)

{
  int local_30;
  int local_2c;
  REF_INT col;
  REF_INT row;
  REF_DBL *vectors_local;
  REF_DBL *values_local;
  REF_DBL *a_local;
  REF_INT n_local;
  
  if (a != (REF_DBL *)0x0) {
    for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
        printf(" ");
        printf("%15.7e",a[local_2c + n * local_30]);
      }
      printf("\n");
    }
  }
  for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
    printf("%23.15e",values[local_2c]);
    printf(" |");
    for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
      printf("%15.7e",vectors[local_2c + n * local_30]);
      if (local_30 < n + -1) {
        printf(" ");
      }
    }
    printf("\n");
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_eig(REF_INT n, REF_DBL *a, REF_DBL *values,
                                       REF_DBL *vectors) {
  REF_INT row, col;

  if (NULL != a) {
    for (row = 0; row < n; row++) {
      for (col = 0; col < n; col++) {
        printf(" ");
        printf("%15.7e", a[row + n * col]);
      }
      printf("\n");
    }
  }
  for (row = 0; row < n; row++) {
    printf("%23.15e", values[row]);
    printf(" |");
    for (col = 0; col < n; col++) {
      printf("%15.7e", vectors[row + n * col]);
      if (col < n - 1) printf(" ");
    }
    printf("\n");
  }

  return REF_SUCCESS;
}